

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void diy::
     reduce<void(*)(PointBlock<3u>*,diy::ReduceProxy_const&,diy::RegularMergePartners_const&),diy::RegularMergePartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,RegularMergePartners *partners,
               _func_void_PointBlock<3U>_ptr_ReduceProxy_ptr_RegularMergePartners_ptr **reduce,
               ReduceNeverSkip *skip)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  element_type *peVar6;
  size_type sVar7;
  ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *in_RDX;
  Master *in_RDI;
  ReduceNeverSkip *in_R8;
  vector<int,_std::allocator<int>_> incoming_gids;
  uint i;
  int expected;
  uint round;
  int original_expected;
  shared_ptr<diy::spd::logger> log;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  Master *in_stack_fffffffffffffcf0;
  Master *this;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  undefined4 uVar8;
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *in_stack_fffffffffffffd00;
  function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
  *this_00;
  Master *in_stack_fffffffffffffd08;
  _Any_data *in_stack_fffffffffffffd10;
  Master *in_stack_fffffffffffffd18;
  ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *in_stack_fffffffffffffd20;
  ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  Master *in_stack_fffffffffffffd38;
  ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *pRVar9;
  undefined4 in_stack_fffffffffffffd4c;
  SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip> local_280 [2];
  function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
  local_248 [2];
  MemoryManagement *in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe1f;
  Master *in_stack_fffffffffffffe20;
  _Any_data local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [48];
  Master *in_stack_fffffffffffffee8;
  undefined4 local_50;
  int local_3c;
  ReduceNeverSkip *local_28;
  ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *local_18;
  Master *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  get_logger();
  local_3c = Master::expected(local_8);
  local_50 = 0;
  while( true ) {
    uVar4 = (ulong)(uint)local_50;
    sVar5 = RegularPartners::rounds((RegularPartners *)0x1f8d47);
    iVar3 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    if (sVar5 <= uVar4) break;
    peVar6 = Catch::clara::std::
             __shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f8d68);
    spd::logger::debug<unsigned_int>(peVar6,"Round {}",&stack0xffffffffffffffb0);
    std::function<void(PointBlock<3u>*,diy::ReduceProxy_const&,diy::RegularMergePartners_const&)>::
    function<void(*const&)(PointBlock<3u>*,diy::ReduceProxy_const&,diy::RegularMergePartners_const&),void>
              ((function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                *)in_stack_fffffffffffffd00,
               (_func_void_PointBlock<3U>_ptr_ReduceProxy_ptr_RegularMergePartners_ptr **)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    detail::ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners>::ReductionFunctor
              (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
               (Callback *)in_stack_fffffffffffffd10,
               (RegularMergePartners *)in_stack_fffffffffffffd08,
               (Assigner *)in_stack_fffffffffffffd00);
    detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>::SkipInactiveOr
              ((SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip> *)
               (local_148 + 0x20),local_50,(RegularMergePartners *)local_18,local_28);
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::RegularMergePartners,diy::detail::ReduceNeverSkip>,void>
              ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffffd00,
               (SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip> *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    Master::foreach<diy::detail::ReductionFunctor<PointBlock<3u>,diy::RegularMergePartners>>
              ((Master *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,(Skip *)in_stack_fffffffffffffd20);
    Catch::clara::std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x1f8e47);
    detail::ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners>::~ReductionFunctor
              ((ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *)
               in_stack_fffffffffffffcf0);
    Catch::clara::std::
    function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>::
    ~function((function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
               *)0x1f8e61);
    Master::execute(in_stack_fffffffffffffee8);
    local_148._28_4_ = 0;
    for (local_148._24_4_ = 0; uVar8 = local_148._24_4_, uVar2 = Master::size((Master *)0x1f8e9e),
        (uint)uVar8 < uVar2; local_148._24_4_ = local_148._24_4_ + 1) {
      iVar3 = local_50 + 1;
      pRVar9 = local_18;
      Master::gid(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
      bVar1 = RegularMergePartners::active
                        ((RegularMergePartners *)CONCAT44(in_stack_fffffffffffffd4c,iVar3),
                         (int)((ulong)pRVar9 >> 0x20),(int)pRVar9,in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd4c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd4c);
      if (bVar1) {
        in_stack_fffffffffffffd38 = (Master *)local_148;
        Catch::clara::std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x1f8f1f);
        in_stack_fffffffffffffd34 = local_50 + 1;
        in_stack_fffffffffffffd28 = local_18;
        Master::gid(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
        RegularMergePartners::incoming
                  ((RegularMergePartners *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                   in_stack_fffffffffffffcf8,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0,
                   (Master *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        sVar7 = Catch::clara::std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_148);
        local_148._28_4_ = local_148._28_4_ + (int)sVar7;
        in_stack_fffffffffffffd18 = local_8;
        Master::gid(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
        in_stack_fffffffffffffd20 =
             (ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *)
             Master::incoming(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear(in_stack_fffffffffffffd00);
        Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
      }
    }
    Master::set_expected(local_8,local_148._28_4_);
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    local_1a8._M_unused._M_object = (void *)0x0;
    local_1a8._8_8_ = 0;
    in_stack_fffffffffffffd10 = &local_1a8;
    in_stack_fffffffffffffd08 = local_8;
    MemoryManagement::MemoryManagement((MemoryManagement *)in_stack_fffffffffffffcf0);
    Master::flush(in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe1f,
                  in_stack_fffffffffffffe10);
    MemoryManagement::~MemoryManagement((MemoryManagement *)in_stack_fffffffffffffcf0);
    local_50 = local_50 + 1;
  }
  peVar6 = Catch::clara::std::
           __shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f9169);
  spd::logger::debug<unsigned_int>(peVar6,"Round {}",&stack0xffffffffffffffb0);
  this_00 = local_248;
  this = local_8;
  uVar8 = local_50;
  std::function<void(PointBlock<3u>*,diy::ReduceProxy_const&,diy::RegularMergePartners_const&)>::
  function<void(*const&)(PointBlock<3u>*,diy::ReduceProxy_const&,diy::RegularMergePartners_const&),void>
            (this_00,(_func_void_PointBlock<3U>_ptr_ReduceProxy_ptr_RegularMergePartners_ptr **)
                     CONCAT44(local_50,in_stack_fffffffffffffcf8));
  detail::ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners>::ReductionFunctor
            (in_stack_fffffffffffffd20,iVar3,(Callback *)in_stack_fffffffffffffd10,
             (RegularMergePartners *)in_stack_fffffffffffffd08,(Assigner *)this_00);
  detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>::SkipInactiveOr
            (local_280,local_50,(RegularMergePartners *)local_18,local_28);
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<diy::RegularMergePartners,diy::detail::ReduceNeverSkip>,void>
            ((function<bool_(int,_const_diy::Master_&)> *)this_00,
             (SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip> *)
             CONCAT44(uVar8,in_stack_fffffffffffffcf8));
  Master::foreach<diy::detail::ReductionFunctor<PointBlock<3u>,diy::RegularMergePartners>>
            ((Master *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             in_stack_fffffffffffffd28,(Skip *)in_stack_fffffffffffffd20);
  Catch::clara::std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x1f9242);
  detail::ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners>::~ReductionFunctor
            ((ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *)this);
  Catch::clara::std::
  function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>::
  ~function((function<void_(PointBlock<3U>_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
             *)0x1f925c);
  Master::set_expected(local_8,local_3c);
  Catch::clara::std::shared_ptr<diy::spd::logger>::~shared_ptr
            ((shared_ptr<diy::spd::logger> *)0x1f927f);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}